

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-traverse.c
# Opt level: O1

void print_full_field_name(FILE *f,int print_dims,int compound_as_array)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  coda_type_class type_class_1;
  coda_type_class type_class;
  int local_38;
  int local_34;
  
  if (print_dims == 1) {
    if (traverse_info.current_depth < 1) {
      iVar4 = 0;
    }
    else {
      lVar2 = 0;
      iVar4 = 0;
      iVar3 = 0;
      do {
        iVar1 = coda_type_get_class(traverse_info.type[lVar2],&local_34);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        if (local_34 == 1) {
          if (lVar2 == 0) {
            fputc(0x2f,(FILE *)f);
          }
          if (0 < traverse_info.array_info[iVar4].num_dims) {
            fputc(0x5b,(FILE *)f);
            print_array_dim(f,iVar4);
            fputc(0x5d,(FILE *)f);
          }
          iVar4 = iVar4 + 1;
        }
        else if (local_34 == 0) {
          fprintf((FILE *)f,"/%s",traverse_info.field_name[iVar3]);
          iVar3 = iVar3 + 1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < traverse_info.current_depth);
    }
    if (compound_as_array == 0) {
      return;
    }
    if (traverse_info.num_arrays <= iVar4) {
      return;
    }
    fputc(0x5b,(FILE *)f);
    print_array_dim(f,iVar4);
  }
  else {
    if (0 < traverse_info.num_records) {
      lVar2 = 0;
      do {
        if (lVar2 != 0) {
          fputc(0x2e,(FILE *)f);
        }
        fputs(traverse_info.field_name[lVar2],(FILE *)f);
        lVar2 = lVar2 + 1;
      } while (lVar2 < traverse_info.num_records);
    }
    if (print_dims != 2) {
      return;
    }
    if (traverse_info.current_depth < 1) {
      iVar4 = 0;
    }
    else {
      lVar2 = 0;
      iVar4 = 0;
      do {
        iVar3 = coda_type_get_class(traverse_info.type[lVar2],&local_38);
        if (iVar3 != 0) {
          handle_coda_error();
        }
        if ((local_38 == 1) && (0 < traverse_info.array_info[iVar4].num_dims)) {
          if (traverse_info.array_info[iVar4].dim_id == 0) {
            fwrite(" [",2,1,(FILE *)f);
          }
          else {
            fputc(0x2c,(FILE *)f);
          }
          print_array_dim(f,iVar4);
          iVar4 = iVar4 + 1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < traverse_info.current_depth);
    }
    if ((compound_as_array != 0) && (iVar4 < traverse_info.num_arrays)) {
      if (traverse_info.array_info[iVar4].dim_id == 0) {
        fwrite(" [",2,1,(FILE *)f);
      }
      else {
        fputc(0x2c,(FILE *)f);
      }
      print_array_dim(f,iVar4);
      iVar4 = iVar4 + 1;
    }
    if (iVar4 < 1) {
      return;
    }
  }
  fputc(0x5d,(FILE *)f);
  return;
}

Assistant:

void print_full_field_name(FILE *f, int print_dims, int compound_as_array)
{
    int i;

    if (print_dims == 1)
    {
        int record_id = 0;
        int array_id = 0;

        for (i = 0; i < traverse_info.current_depth; i++)
        {
            coda_type_class type_class;

            if (coda_type_get_class(traverse_info.type[i], &type_class) != 0)
            {
                handle_coda_error();
            }
            switch (type_class)
            {
                case coda_record_class:
                    fprintf(f, "/%s", traverse_info.field_name[record_id]);
                    record_id++;
                    break;
                case coda_array_class:
                    if (i == 0)
                    {
                        fprintf(f, "/");
                    }
                    if (traverse_info.array_info[array_id].num_dims > 0)
                    {
                        fprintf(f, "[");
                        print_array_dim(f, array_id);
                        fprintf(f, "]");
                    }
                    array_id++;
                    break;
                default:
                    break;
            }
        }
        if (compound_as_array && array_id < traverse_info.num_arrays)
        {
            fprintf(f, "[");
            print_array_dim(f, array_id);
            fprintf(f, "]");
        }
    }
    else
    {
        for (i = 0; i < traverse_info.num_records; i++)
        {
            if (i > 0)
            {
                fprintf(f, ".");
            }
            fprintf(f, "%s", traverse_info.field_name[i]);
        }

        if (print_dims == 2)
        {
            int array_id = 0;

            for (i = 0; i < traverse_info.current_depth; i++)
            {
                coda_type_class type_class;

                if (coda_type_get_class(traverse_info.type[i], &type_class) != 0)
                {
                    handle_coda_error();
                }
                if (type_class == coda_array_class)
                {
                    if (traverse_info.array_info[array_id].num_dims > 0)
                    {
                        if (traverse_info.array_info[array_id].dim_id == 0)
                        {
                            fprintf(f, " [");
                        }
                        else
                        {
                            fprintf(f, ",");
                        }
                        print_array_dim(f, array_id);
                        array_id++;
                    }
                }
            }
            if (compound_as_array && array_id < traverse_info.num_arrays)
            {
                if (traverse_info.array_info[array_id].dim_id == 0)
                {
                    fprintf(f, " [");
                }
                else
                {
                    fprintf(f, ",");
                }
                print_array_dim(f, array_id);
                array_id++;
            }
            if (array_id > 0)
            {
                fprintf(f, "]");
            }
        }
    }
}